

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

shared_ptr<cppnet::BufferBlock> __thiscall
cppnet::List<cppnet::BufferBlock>::PopFront(List<cppnet::BufferBlock> *this)

{
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  int *in_RSI;
  shared_ptr<cppnet::BufferBlock> sVar1;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (*(long *)(in_RSI + 2) == 0) {
    *(undefined8 *)this = 0;
    (this->_head).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    this_00 = (__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 2);
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)this,this_00);
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               &(this_00->_M_ptr->super_ListSlot<cppnet::BufferBlock>)._next.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&local_30)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    in_RDX._M_pi = extraout_RDX;
    if (this_00->_M_ptr == (element_type *)0x0) {
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 6));
      in_RDX._M_pi = extraout_RDX_00;
    }
    *in_RSI = *in_RSI + -1;
  }
  sVar1.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BufferBlock>)
         sVar1.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> PopFront() {
        if (!_head) {
            return nullptr;
        }

        auto ret = _head;
        _head = _head->GetNext();
        if (!_head) {
            _tail.reset();
        }
        
        _size--;

        return ret;
    }